

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::SortImports::buildGroupAST
          (SortImports *this,ImportElems *imports,AST *body,Fodder *groupOpenFodder)

{
  pointer pIVar1;
  Allocator *this_00;
  uint uVar2;
  Local *pLVar3;
  uint uVar4;
  long lVar5;
  Fodder *__x;
  long lVar6;
  initializer_list<jsonnet::internal::Local::Bind> __l;
  Fodder fodder;
  allocator_type local_189;
  Local *local_188;
  SortImports *local_180;
  ImportElems *local_178;
  Fodder *local_170;
  ulong local_168;
  long local_160;
  LocationRange local_158;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_118;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_f8;
  Bind local_e0;
  
  uVar2 = (int)((long)(imports->
                      super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(imports->
                      super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4f72c235;
  uVar4 = uVar2 - 1;
  if (-1 < (int)uVar4) {
    local_168 = (ulong)uVar2 + 0xfffffffe;
    lVar5 = (ulong)uVar4 + 1;
    lVar6 = (ulong)uVar4 * 0xe8 + 0x38;
    local_188 = (Local *)body;
    local_180 = this;
    local_178 = imports;
    local_170 = groupOpenFodder;
    do {
      pIVar1 = (local_178->
               super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_118.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __x = &pIVar1[local_168 & 0xffffffff].adjacentFodder;
      if (lVar5 == 1) {
        __x = local_170;
      }
      local_160 = lVar5;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&local_118,__x);
      this_00 = local_180->alloc;
      local_158.file._M_dataplus._M_p = (pointer)&local_158.file.field_2;
      local_158.file._M_string_length = 0;
      local_158.file.field_2._M_local_buf[0] = '\0';
      local_158.end.line = 0;
      local_158.end.column = 0;
      local_158.begin.line = 0;
      local_158.begin.column = 0;
      Local::Bind::Bind(&local_e0,(Bind *)((long)&(pIVar1->key)._M_dataplus._M_p + lVar6));
      __l._M_len = 1;
      __l._M_array = &local_e0;
      std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
      vector(&local_f8,__l,&local_189);
      pLVar3 = Allocator::
               make<jsonnet::internal::Local,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                         (this_00,&local_158,&local_118,&local_f8,(AST **)&local_188);
      std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
      ~vector(&local_f8);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_e0.closeFodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_e0.parenRightFodder);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector(&local_e0.params);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_e0.parenLeftFodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_e0.opFodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_e0.varFodder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.file._M_dataplus._M_p != &local_158.file.field_2) {
        operator_delete(local_158.file._M_dataplus._M_p,
                        CONCAT71(local_158.file.field_2._M_allocated_capacity._1_7_,
                                 local_158.file.field_2._M_local_buf[0]) + 1);
      }
      local_188 = pLVar3;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_118);
      local_168 = local_168 - 1;
      lVar6 = lVar6 + -0xe8;
      lVar5 = local_160 + -1;
      body = &local_188->super_AST;
    } while (lVar5 != 0 && 0 < local_160);
  }
  return &((Local *)body)->super_AST;
}

Assistant:

AST *buildGroupAST(ImportElems &imports, AST *body, const Fodder &groupOpenFodder)
    {
        for (int i = imports.size() - 1; i >= 0; --i) {
            auto &import = imports[i];
            Fodder fodder;
            if (i == 0) {
                fodder = groupOpenFodder;
            } else {
                fodder = imports[i - 1].adjacentFodder;
            }
            auto *local =
                alloc.make<Local>(LocationRange(), fodder, Local::Binds({import.bind}), body);
            body = local;
        }

        return body;
    }